

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs2.c
# Opt level: O0

int Wlc_NtkAbsCore2(Wlc_Ntk_t *p,Wlc_Par_t *pPars)

{
  int iVar1;
  int nPpis;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  abctime aVar5;
  Wlc_Ntk_t *p_00;
  Gia_Man_t *pGVar6;
  Vec_Int_t *vRefine_00;
  abctime aVar7;
  Wlc_Ntk_t *pAbs;
  Gia_Man_t *pTemp;
  Gia_Man_t *pGia;
  Vec_Int_t *vRefine;
  Vec_Int_t *vPisNew;
  Abc_Cex_t *pCex;
  Aig_Man_t *pAig;
  Pdr_Par_t *pPdrPars;
  Pdr_Par_t PdrPars;
  Vec_Bit_t *vUnmark;
  int RetValue;
  int nDcFlops;
  int nNodes;
  int nIters;
  abctime clk;
  Wlc_Par_t *pPars_local;
  Wlc_Ntk_t *p_local;
  
  aVar5 = Abc_Clock();
  vUnmark._0_4_ = -1;
  iVar1 = Wlc_NtkObjNumMax(p);
  PdrPars.pInvFileName = (char *)Vec_BitStart(iVar1);
  pAig = (Aig_Man_t *)&pPdrPars;
  Pdr_ManSetDefaultParams((Pdr_Par_t *)pAig);
  (pAig->Ghost).Id = 1;
  (pAig->Ghost).TravId = 1;
  *(undefined4 *)&(pAig->Ghost).field_0x1c = 0;
  *(int *)((long)&(pAig->Ghost).field_5 + 4) = pPars->fPdrVerbose;
  nDcFlops = 1;
  do {
    if (pPars->nIterMax <= nDcFlops) {
LAB_00b389ef:
      Vec_BitFree((Vec_Bit_t *)PdrPars.pInvFileName);
      if (pPars->fVerbose != 0) {
        printf("\n");
      }
      printf("Abstraction ");
      if ((int)vUnmark == 0) {
        printf("resulted in a real CEX");
      }
      else if ((int)vUnmark == 1) {
        printf("is successfully proved");
      }
      else {
        printf("timed out");
      }
      printf(" after %d iterations. ",(ulong)(uint)nDcFlops);
      aVar7 = Abc_Clock();
      Abc_PrintTime(1,"Time",aVar7 - aVar5);
      return (int)vUnmark;
    }
    if (pPars->fVerbose != 0) {
      printf("\nIteration %d:\n",(ulong)(uint)nDcFlops);
    }
    p_00 = Wlc_NtkAbs(p,pPars,(Vec_Bit_t *)PdrPars.pInvFileName,&vRefine,pPars->fVerbose);
    pGVar6 = Wlc_NtkBitBlast(p_00,(Wlc_BstPar_t *)0x0);
    iVar1 = Wlc_NtkDcFlopNum(p_00);
    pTemp = pGVar6;
    if (0 < iVar1) {
      nPpis = Wlc_NtkCountObjBits(p,vRefine);
      pTemp = Gia_ManPermuteInputs(pGVar6,nPpis,iVar1);
      Gia_ManStop(pGVar6);
    }
    if (pPars->fXorOutput != 0) {
      pGVar6 = Gia_ManTransformMiter2(pTemp);
      Gia_ManStop(pTemp);
      pTemp = pGVar6;
    }
    if (pPars->fVerbose != 0) {
      uVar2 = Wlc_NtkObjNum(p_00);
      uVar3 = Vec_IntSize(vRefine);
      printf("Derived abstraction with %d objects and %d PPIs. Bit-blasted AIG stats are:\n",
             (ulong)uVar2,(ulong)uVar3);
      Gia_ManPrintStats(pTemp,(Gps_Par_t *)0x0);
    }
    Wlc_NtkFree(p_00);
    pCex = (Abc_Cex_t *)Gia_ManToAigSimple(pTemp);
    vUnmark._0_4_ = Pdr_ManSolve((Aig_Man_t *)pCex,(Pdr_Par_t *)pAig);
    vPisNew = *(Vec_Int_t **)&pCex[0x14].nRegs;
    pCex[0x14].nRegs = 0;
    pCex[0x14].nPis = 0;
    Aig_ManStop((Aig_Man_t *)pCex);
    if (vPisNew == (Vec_Int_t *)0x0) {
      if ((int)vUnmark == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcAbs2.c"
                      ,0x16d,"int Wlc_NtkAbsCore2(Wlc_Ntk_t *, Wlc_Par_t *)");
      }
      Gia_ManStop(pTemp);
      Vec_IntFree(vRefine);
      goto LAB_00b389ef;
    }
    vRefine_00 = Wlc_NtkAbsRefinement(p,pTemp,(Abc_Cex_t *)vPisNew,vRefine);
    Gia_ManStop(pTemp);
    Vec_IntFree(vRefine);
    if (vRefine_00 == (Vec_Int_t *)0x0) {
      Abc_CexFree((Abc_Cex_t *)vPisNew);
      goto LAB_00b389ef;
    }
    uVar2 = Wlc_NtkRemoveFromAbstraction(p,vRefine_00,(Vec_Bit_t *)PdrPars.pInvFileName);
    if (pPars->fVerbose != 0) {
      uVar3 = vPisNew->nSize;
      uVar4 = Vec_IntSize(vRefine_00);
      printf("Refinement of CEX in frame %d came up with %d un-abstacted PPIs, whose MFFCs include %d objects.\n"
             ,(ulong)uVar3,(ulong)uVar4,(ulong)uVar2);
    }
    Vec_IntFree(vRefine_00);
    Abc_CexFree((Abc_Cex_t *)vPisNew);
    nDcFlops = nDcFlops + 1;
  } while( true );
}

Assistant:

int Wlc_NtkAbsCore2( Wlc_Ntk_t * p, Wlc_Par_t * pPars )
{
    abctime clk = Abc_Clock();
    int nIters, nNodes, nDcFlops, RetValue = -1;
    // start the bitmap to mark objects that cannot be abstracted because of refinement
    // currently, this bitmap is empty because abstraction begins without refinement
    Vec_Bit_t * vUnmark = Vec_BitStart( Wlc_NtkObjNumMax(p) );
    // set up parameters to run PDR
    Pdr_Par_t PdrPars, * pPdrPars = &PdrPars;
    Pdr_ManSetDefaultParams( pPdrPars );
    pPdrPars->fUseAbs    = 1;   // use 'pdr -t'  (on-the-fly abstraction)
    pPdrPars->fCtgs      = 1;   // use 'pdr -nc' (improved generalization)
    pPdrPars->fSkipDown  = 0;   // use 'pdr -nc' (improved generalization)
    //pPdrPars->nRestLimit = 500; // reset queue or proof-obligations when it gets larger than this
    pPdrPars->fVerbose   = pPars->fPdrVerbose;
    // perform refinement iterations
    for ( nIters = 1; nIters < pPars->nIterMax; nIters++ )
    {
        Aig_Man_t * pAig;
        Abc_Cex_t * pCex;
        Vec_Int_t * vPisNew, * vRefine;  
        Gia_Man_t * pGia, * pTemp;
        Wlc_Ntk_t * pAbs;

        if ( pPars->fVerbose )
            printf( "\nIteration %d:\n", nIters );

        // get abstracted GIA and the set of pseudo-PIs (vPisNew)
        pAbs = Wlc_NtkAbs( p, pPars, vUnmark, &vPisNew, pPars->fVerbose );
        pGia = Wlc_NtkBitBlast( pAbs, NULL );

        // if the abstraction has flops with DC-init state,
        // new PIs were introduced by bit-blasting at the end of the PI list
        // here we move these variables to be *before* PPIs, because
        // PPIs are supposed to be at the end of the PI list for refinement
        nDcFlops = Wlc_NtkDcFlopNum(pAbs);
        if ( nDcFlops > 0 ) // DC-init flops are present
        {
            pGia = Gia_ManPermuteInputs( pTemp = pGia, Wlc_NtkCountObjBits(p, vPisNew), nDcFlops );
            Gia_ManStop( pTemp );
        }
        // if the word-level outputs have to be XORs, this is a place to do it
        if ( pPars->fXorOutput )
        {
            pGia = Gia_ManTransformMiter2( pTemp = pGia );
            Gia_ManStop( pTemp );
        }
        if ( pPars->fVerbose )
        {
            printf( "Derived abstraction with %d objects and %d PPIs. Bit-blasted AIG stats are:\n", Wlc_NtkObjNum(pAbs), Vec_IntSize(vPisNew) ); 
            Gia_ManPrintStats( pGia, NULL );
        }
        Wlc_NtkFree( pAbs );

        // try to prove abstracted GIA by converting it to AIG and calling PDR
        pAig = Gia_ManToAigSimple( pGia );
        RetValue = Pdr_ManSolve( pAig, pPdrPars );
        pCex = pAig->pSeqModel; pAig->pSeqModel = NULL;
        Aig_ManStop( pAig );

        // consider outcomes
        if ( pCex == NULL ) 
        {
            assert( RetValue ); // proved or undecided
            Gia_ManStop( pGia );
            Vec_IntFree( vPisNew );
            break;
        }

        // perform refinement
        vRefine = Wlc_NtkAbsRefinement( p, pGia, pCex, vPisNew );
        Gia_ManStop( pGia );
        Vec_IntFree( vPisNew );
        if ( vRefine == NULL ) // real CEX
        {
            Abc_CexFree( pCex ); // return CEX in the future
            break;
        }

        // update the set of objects to be un-abstracted
        nNodes = Wlc_NtkRemoveFromAbstraction( p, vRefine, vUnmark );
        if ( pPars->fVerbose )
            printf( "Refinement of CEX in frame %d came up with %d un-abstacted PPIs, whose MFFCs include %d objects.\n", pCex->iFrame, Vec_IntSize(vRefine), nNodes );
        Vec_IntFree( vRefine );
        Abc_CexFree( pCex );
    }
    Vec_BitFree( vUnmark );
    // report the result
    if ( pPars->fVerbose )
        printf( "\n" );
    printf( "Abstraction " );
    if ( RetValue == 0 )
        printf( "resulted in a real CEX" );
    else if ( RetValue == 1 )
        printf( "is successfully proved" );
    else 
        printf( "timed out" );
    printf( " after %d iterations. ", nIters );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return RetValue;
}